

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

bool despot::util::tinyxml::TiXmlBase::StringEqual
               (char *p,char *tag,bool ignoreCase,TiXmlEncoding encoding)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1ef,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (tag == (char *)0x0) {
    __assert_fail("tag",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1f0,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  cVar1 = *p;
  if (cVar1 == '\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1f2,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (ignoreCase) {
    lVar5 = 0;
    do {
      cVar4 = tag[lVar5];
      if (cVar4 == '\0') {
        return true;
      }
      iVar2 = tolower((int)cVar1);
      iVar3 = tolower((int)cVar4);
      if (iVar2 != iVar3) {
        return false;
      }
      cVar1 = p[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (cVar1 != '\0');
    if (tag[lVar5] == '\0') {
      return true;
    }
  }
  else {
    lVar5 = 0;
    do {
      cVar4 = tag[lVar5];
      if (cVar1 != cVar4) goto LAB_00171e44;
      cVar1 = p[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (cVar1 != '\0');
    cVar4 = tag[lVar5];
LAB_00171e44:
    if (cVar4 == '\0') {
      return true;
    }
  }
  return false;
}

Assistant:

bool TiXmlBase::StringEqual(const char* p, const char* tag, bool ignoreCase,
	TiXmlEncoding encoding) {
	assert(p);
	assert(tag);
	if (!p || !*p) {
		assert(0);
		return false;
	}

	const char* q = p;

	if (ignoreCase) {
		while (*q && *tag && ToLower(*q, encoding) == ToLower(*tag, encoding)) {
			++q;
			++tag;
		}

		if (*tag == 0)
			return true;
	} else {
		while (*q && *tag && *q == *tag) {
			++q;
			++tag;
		}

		if (*tag == 0) // Have we found the end of the tag, and everything equal?
			return true;
	}
	return false;
}